

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O3

void __thiscall CDataFileReader::GetType(CDataFileReader *this,int Type,int *pStart,int *pNum)

{
  CDatafile *pCVar1;
  CDatafileItemType *pCVar2;
  long lVar3;
  long lVar4;
  
  *pStart = 0;
  *pNum = 0;
  pCVar1 = this->m_pDataFile;
  if ((pCVar1 != (CDatafile *)0x0) && (lVar3 = (long)(pCVar1->m_Header).m_NumItemTypes, 0 < lVar3))
  {
    pCVar2 = (pCVar1->m_Info).m_pItemTypes;
    lVar4 = 0;
    do {
      if (*(int *)((long)&pCVar2->m_Type + lVar4) == Type) {
        *pStart = *(int *)((long)&pCVar2->m_Start + lVar4);
        *pNum = *(int *)((long)&pCVar2->m_Num + lVar4);
        return;
      }
      lVar4 = lVar4 + 0xc;
    } while (lVar3 * 0xc != lVar4);
  }
  return;
}

Assistant:

void CDataFileReader::GetType(int Type, int *pStart, int *pNum)
{
	*pStart = 0;
	*pNum = 0;

	if(!m_pDataFile)
		return;

	for(int i = 0; i < m_pDataFile->m_Header.m_NumItemTypes; i++)
	{
		if(m_pDataFile->m_Info.m_pItemTypes[i].m_Type == Type)
		{
			*pStart = m_pDataFile->m_Info.m_pItemTypes[i].m_Start;
			*pNum = m_pDataFile->m_Info.m_pItemTypes[i].m_Num;
			return;
		}
	}
}